

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O1

void instruct_cbr(Proc *proc,Pseudo *condition_pseudo,BasicBlock *true_block,BasicBlock *false_block
                 ,uint line_number)

{
  C_MemoryAllocator *pCVar1;
  uint *ptr;
  uint *ptr_00;
  undefined1 *ptr_01;
  Pseudo *pseudo;
  
  pCVar1 = proc->linearizer->compiler_state->allocator;
  ptr = (uint *)(*pCVar1->calloc)(pCVar1->arena,1,0x30);
  *ptr = *ptr & 0xfffffff0 | 10;
  *(BasicBlock **)(ptr + 2) = true_block;
  pCVar1 = proc->linearizer->compiler_state->allocator;
  ptr_00 = (uint *)(*pCVar1->calloc)(pCVar1->arena,1,0x30);
  *ptr_00 = *ptr_00 & 0xfffffff0 | 10;
  *(BasicBlock **)(ptr_00 + 2) = false_block;
  pCVar1 = proc->linearizer->compiler_state->allocator;
  ptr_01 = (undefined1 *)(*pCVar1->calloc)(pCVar1->arena,1,0x28);
  *ptr_01 = 0x48;
  *(uint *)(ptr_01 + 0x20) = line_number;
  if (((undefined1  [48])*condition_pseudo & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
    pseudo = indexed_load(proc,condition_pseudo);
    condition_pseudo = pseudo;
  }
  else {
    pseudo = (Pseudo *)0x0;
  }
  raviX_ptrlist_add((PtrList **)(ptr_01 + 8),condition_pseudo,
                    proc->linearizer->compiler_state->allocator);
  if ((*ptr & 0xf) != 0xe) {
    raviX_ptrlist_add((PtrList **)(ptr_01 + 0x10),ptr,proc->linearizer->compiler_state->allocator);
    if ((*ptr_00 & 0xf) != 0xe) {
      raviX_ptrlist_add((PtrList **)(ptr_01 + 0x10),ptr_00,
                        proc->linearizer->compiler_state->allocator);
      if ((*(BasicBlock **)(ptr_01 + 0x18) != (BasicBlock *)0x0) &&
         (*(BasicBlock **)(ptr_01 + 0x18) != proc->current_bb)) {
        __assert_fail("insn->block == NULL || insn->block == proc->current_bb",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x1b1,"void add_instruction(Proc *, Instruction *)");
      }
      raviX_ptrlist_add((PtrList **)&proc->current_bb->insns,ptr_01,
                        proc->linearizer->compiler_state->allocator);
      *(BasicBlock **)(ptr_01 + 0x18) = proc->current_bb;
      if (pseudo != (Pseudo *)0x0) {
        free_temp_pseudo(proc,pseudo,false);
        return;
      }
      return;
    }
  }
  __assert_fail("pseudo->type != PSEUDO_INDEXED",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                ,0x193,"void add_instruction_target(Proc *, Instruction *, Pseudo *)");
}

Assistant:

static void instruct_cbr(Proc *proc, Pseudo *condition_pseudo, BasicBlock *true_block,
			 BasicBlock *false_block, unsigned line_number)
{
	Pseudo *true_pseudo = allocate_block_pseudo(proc, true_block);
	Pseudo *false_pseudo = allocate_block_pseudo(proc, false_block);
	Instruction *insn = allocate_instruction(proc, op_cbr, line_number);
	Pseudo *tofree = add_instruction_operand(proc, insn, condition_pseudo);
	add_instruction_target(proc, insn, true_pseudo);
	add_instruction_target(proc, insn, false_pseudo);
	add_instruction(proc, insn);
	if (tofree)
		free_temp_pseudo(proc, tofree, false);
}